

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_GeneratorAndPlugin_DescriptorSetIn_Test::TestBody
          (CommandLineInterfaceTest_GeneratorAndPlugin_DescriptorSetIn_Test *this)

{
  FileDescriptorProto *this_00;
  uint32_t *puVar1;
  Arena *pAVar2;
  DescriptorProto *this_01;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  string_view local_b0 [2];
  FileDescriptorProto *local_90;
  FileDescriptorProto *file_descriptor_proto;
  FileDescriptorSet file_descriptor_set;
  CommandLineInterfaceTest_GeneratorAndPlugin_DescriptorSetIn_Test *this_local;
  
  file_descriptor_set.field_0._48_8_ = this;
  FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)&file_descriptor_proto);
  this_00 = FileDescriptorSet::add_file((FileDescriptorSet *)&file_descriptor_proto);
  local_90 = this_00;
  puVar1 = protobuf::internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
  *(byte *)puVar1 = (byte)*puVar1 | 1;
  pAVar2 = protobuf::MessageLite::GetArena((MessageLite *)this_00);
  protobuf::internal::ArenaStringPtr::Set(&(this_00->field_0)._impl_.name_,"foo.proto",pAVar2);
  this_01 = FileDescriptorProto::add_message_type(local_90);
  puVar1 = protobuf::internal::HasBits<1>::operator[](&(this_01->field_0)._impl_._has_bits_,0);
  *(byte *)puVar1 = (byte)*puVar1 | 1;
  pAVar2 = protobuf::MessageLite::GetArena((MessageLite *)this_01);
  protobuf::internal::ArenaStringPtr::Set(&(this_01->field_0)._impl_.name_,"Foo",pAVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_b0,"foo.bin");
  CommandLineInterfaceTest::WriteDescriptorSet
            (&this->super_CommandLineInterfaceTest,local_b0[0],
             (FileDescriptorSet *)&file_descriptor_proto);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir --descriptor_set_in=$tmpdir/foo.bin foo.proto"
             ,&local_d1);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"test_generator",&local_f9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,anon_var_dwarf_37cdd0 + 5,&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"foo.proto",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Foo",&local_171);
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_f8,&local_120,&local_148,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"test_plugin",&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,anon_var_dwarf_37cdd0 + 5,&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"foo.proto",&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"Foo",&local_211);
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_198,&local_1c0,&local_1e8,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)&file_descriptor_proto);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, GeneratorAndPlugin_DescriptorSetIn) {
  // Invoke a generator and a plugin at the same time.

  FileDescriptorSet file_descriptor_set;
  FileDescriptorProto* file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("foo.proto");
  file_descriptor_proto->add_message_type()->set_name("Foo");

  WriteDescriptorSet("foo.bin", &file_descriptor_set);

  Run("protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir "
      "--descriptor_set_in=$tmpdir/foo.bin foo.proto");

  ExpectNoErrors();
  ExpectGenerated("test_generator", "", "foo.proto", "Foo");
  ExpectGenerated("test_plugin", "", "foo.proto", "Foo");
}